

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Permutahedral_representation.h
# Opt level: O1

Vertex_range * __thiscall
Gudhi::coxeter_triangulation::
Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
::vertex_range(Vertex_range *__return_storage_ptr__,
              Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
              *this)

{
  Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  local_78;
  Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  local_40;
  
  local_40.o_it_._M_current =
       (this->partition_).
       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_40.o_end_._M_current =
       (this->partition_).
       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  std::vector<int,_std::allocator<int>_>::vector(&local_40.value_,&this->vertex_);
  local_40.is_end_ = local_40.o_it_._M_current == local_40.o_end_._M_current;
  local_78.o_it_._M_current = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
  local_78.o_end_._M_current = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
  local_78.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_78.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_78.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_78.is_end_ = true;
  boost::
  iterator_range<Gudhi::coxeter_triangulation::Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>>
  ::
  iterator_range<Gudhi::coxeter_triangulation::Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>>
            ((iterator_range<Gudhi::coxeter_triangulation::Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>>
              *)__return_storage_ptr__,&local_40,&local_78);
  if (local_78.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_40.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_40.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_40.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Vertex_range vertex_range() const { return Vertex_range(Vertex_iterator(*this), Vertex_iterator()); }